

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_UpdateGamepads(void)

{
  int iVar1;
  ImGuiIO *pIVar2;
  float v_00;
  float v_9;
  float v_8;
  float v_7;
  float v_6;
  float v_5;
  float v_4;
  float v_3;
  float v_2;
  float v_1;
  float v;
  GLFWgamepadstate gamepad;
  ImGuiIO *io;
  undefined1 in_stack_ffffffffffffff1b;
  ImGuiKey in_stack_ffffffffffffff1c;
  ImGuiIO *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined8 in_stack_ffffffffffffff50;
  float fVar3;
  undefined1 in_stack_ffffffffffffff5b;
  ImGuiKey in_stack_ffffffffffffff5c;
  ImGuiKey key;
  ImGuiIO *in_stack_ffffffffffffff60;
  ImGuiIO *this;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  pIVar2 = ImGui::GetIO();
  if ((pIVar2->ConfigFlags & 2U) != 0) {
    pIVar2->BackendFlags = pIVar2->BackendFlags & 0xfffffffe;
    iVar1 = glfwGetGamepadState((int)in_stack_ffffffffffffff50,
                                (GLFWgamepadstate *)
                                CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    fVar3 = (float)((ulong)in_stack_ffffffffffffff50 >> 0x20);
    if (iVar1 != 0) {
      pIVar2->BackendFlags = pIVar2->BackendFlags | 1;
      ImGuiIO::AddKeyEvent
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(bool)in_stack_ffffffffffffff1b
                );
      ImGuiIO::AddKeyEvent
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(bool)in_stack_ffffffffffffff1b
                );
      ImGuiIO::AddKeyEvent
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(bool)in_stack_ffffffffffffff1b
                );
      ImGuiIO::AddKeyEvent
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(bool)in_stack_ffffffffffffff1b
                );
      ImGuiIO::AddKeyEvent
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(bool)in_stack_ffffffffffffff1b
                );
      ImGuiIO::AddKeyEvent
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(bool)in_stack_ffffffffffffff1b
                );
      ImGuiIO::AddKeyEvent
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(bool)in_stack_ffffffffffffff1b
                );
      ImGuiIO::AddKeyEvent
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(bool)in_stack_ffffffffffffff1b
                );
      ImGuiIO::AddKeyEvent
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(bool)in_stack_ffffffffffffff1b
                );
      ImGuiIO::AddKeyEvent
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(bool)in_stack_ffffffffffffff1b
                );
      ImGuiIO::AddKeyEvent
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(bool)in_stack_ffffffffffffff1b
                );
      ImGuiIO::AddKeyEvent
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(bool)in_stack_ffffffffffffff1b
                );
      Saturate((local_10 - -0.75) / 1.75);
      ImGuiIO::AddKeyAnalogEvent
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(bool)in_stack_ffffffffffffff5b
                 ,fVar3);
      Saturate((local_c - -0.75) / 1.75);
      ImGuiIO::AddKeyAnalogEvent
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(bool)in_stack_ffffffffffffff5b
                 ,fVar3);
      ImGuiIO::AddKeyEvent
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(bool)in_stack_ffffffffffffff1b
                );
      ImGuiIO::AddKeyEvent
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(bool)in_stack_ffffffffffffff1b
                );
      Saturate((local_20 - -0.25) / -0.75);
      ImGuiIO::AddKeyAnalogEvent
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(bool)in_stack_ffffffffffffff5b
                 ,fVar3);
      Saturate((local_20 - 0.25) / 0.75);
      ImGuiIO::AddKeyAnalogEvent
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(bool)in_stack_ffffffffffffff5b
                 ,fVar3);
      v_00 = (local_1c - -0.25) / -0.75;
      key = CONCAT13(0.1 < v_00,(int3)in_stack_ffffffffffffff5c);
      this = pIVar2;
      Saturate(v_00);
      ImGuiIO::AddKeyAnalogEvent(this,key,(bool)in_stack_ffffffffffffff5b,fVar3);
      Saturate((local_1c - 0.25) / 0.75);
      fVar3 = (float)((ulong)pIVar2 >> 0x20);
      ImGuiIO::AddKeyAnalogEvent(this,key,(bool)in_stack_ffffffffffffff5b,fVar3);
      Saturate((local_18 - -0.25) / -0.75);
      ImGuiIO::AddKeyAnalogEvent(this,key,(bool)in_stack_ffffffffffffff5b,fVar3);
      Saturate((local_18 - 0.25) / 0.75);
      ImGuiIO::AddKeyAnalogEvent(this,key,(bool)in_stack_ffffffffffffff5b,fVar3);
      Saturate((local_14 - -0.25) / -0.75);
      ImGuiIO::AddKeyAnalogEvent(this,key,(bool)in_stack_ffffffffffffff5b,fVar3);
      Saturate((local_14 - 0.25) / 0.75);
      ImGuiIO::AddKeyAnalogEvent(this,key,(bool)in_stack_ffffffffffffff5b,fVar3);
    }
  }
  return;
}

Assistant:

static void ImGui_ImplGlfw_UpdateGamepads()
{
    ImGuiIO& io = ImGui::GetIO();
    if ((io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad) == 0) // FIXME: Technically feeding gamepad shouldn't depend on this now that they are regular inputs.
        return;

    io.BackendFlags &= ~ImGuiBackendFlags_HasGamepad;
#if GLFW_HAS_GAMEPAD_API
    GLFWgamepadstate gamepad;
    if (!glfwGetGamepadState(GLFW_JOYSTICK_1, &gamepad))
        return;
    #define MAP_BUTTON(KEY_NO, BUTTON_NO, _UNUSED)          do { io.AddKeyEvent(KEY_NO, gamepad.buttons[BUTTON_NO] != 0); } while (0)
    #define MAP_ANALOG(KEY_NO, AXIS_NO, _UNUSED, V0, V1)    do { float v = gamepad.axes[AXIS_NO]; v = (v - V0) / (V1 - V0); io.AddKeyAnalogEvent(KEY_NO, v > 0.10f, Saturate(v)); } while (0)
#else
    int axes_count = 0, buttons_count = 0;
    const float* axes = glfwGetJoystickAxes(GLFW_JOYSTICK_1, &axes_count);
    const unsigned char* buttons = glfwGetJoystickButtons(GLFW_JOYSTICK_1, &buttons_count);
    if (axes_count == 0 || buttons_count == 0)
        return;
    #define MAP_BUTTON(KEY_NO, _UNUSED, BUTTON_NO)          do { io.AddKeyEvent(KEY_NO, (buttons_count > BUTTON_NO && buttons[BUTTON_NO] == GLFW_PRESS)); } while (0)
    #define MAP_ANALOG(KEY_NO, _UNUSED, AXIS_NO, V0, V1)    do { float v = (axes_count > AXIS_NO) ? axes[AXIS_NO] : V0; v = (v - V0) / (V1 - V0); io.AddKeyAnalogEvent(KEY_NO, v > 0.10f, Saturate(v)); } while (0)
#endif
    io.BackendFlags |= ImGuiBackendFlags_HasGamepad;
    MAP_BUTTON(ImGuiKey_GamepadStart,       GLFW_GAMEPAD_BUTTON_START,          7);
    MAP_BUTTON(ImGuiKey_GamepadBack,        GLFW_GAMEPAD_BUTTON_BACK,           6);
    MAP_BUTTON(ImGuiKey_GamepadFaceLeft,    GLFW_GAMEPAD_BUTTON_X,              2);     // Xbox X, PS Square
    MAP_BUTTON(ImGuiKey_GamepadFaceRight,   GLFW_GAMEPAD_BUTTON_B,              1);     // Xbox B, PS Circle
    MAP_BUTTON(ImGuiKey_GamepadFaceUp,      GLFW_GAMEPAD_BUTTON_Y,              3);     // Xbox Y, PS Triangle
    MAP_BUTTON(ImGuiKey_GamepadFaceDown,    GLFW_GAMEPAD_BUTTON_A,              0);     // Xbox A, PS Cross
    MAP_BUTTON(ImGuiKey_GamepadDpadLeft,    GLFW_GAMEPAD_BUTTON_DPAD_LEFT,      13);
    MAP_BUTTON(ImGuiKey_GamepadDpadRight,   GLFW_GAMEPAD_BUTTON_DPAD_RIGHT,     11);
    MAP_BUTTON(ImGuiKey_GamepadDpadUp,      GLFW_GAMEPAD_BUTTON_DPAD_UP,        10);
    MAP_BUTTON(ImGuiKey_GamepadDpadDown,    GLFW_GAMEPAD_BUTTON_DPAD_DOWN,      12);
    MAP_BUTTON(ImGuiKey_GamepadL1,          GLFW_GAMEPAD_BUTTON_LEFT_BUMPER,    4);
    MAP_BUTTON(ImGuiKey_GamepadR1,          GLFW_GAMEPAD_BUTTON_RIGHT_BUMPER,   5);
    MAP_ANALOG(ImGuiKey_GamepadL2,          GLFW_GAMEPAD_AXIS_LEFT_TRIGGER,     4,      -0.75f,  +1.0f);
    MAP_ANALOG(ImGuiKey_GamepadR2,          GLFW_GAMEPAD_AXIS_RIGHT_TRIGGER,    5,      -0.75f,  +1.0f);
    MAP_BUTTON(ImGuiKey_GamepadL3,          GLFW_GAMEPAD_BUTTON_LEFT_THUMB,     8);
    MAP_BUTTON(ImGuiKey_GamepadR3,          GLFW_GAMEPAD_BUTTON_RIGHT_THUMB,    9);
    MAP_ANALOG(ImGuiKey_GamepadLStickLeft,  GLFW_GAMEPAD_AXIS_LEFT_X,           0,      -0.25f,  -1.0f);
    MAP_ANALOG(ImGuiKey_GamepadLStickRight, GLFW_GAMEPAD_AXIS_LEFT_X,           0,      +0.25f,  +1.0f);
    MAP_ANALOG(ImGuiKey_GamepadLStickUp,    GLFW_GAMEPAD_AXIS_LEFT_Y,           1,      -0.25f,  -1.0f);
    MAP_ANALOG(ImGuiKey_GamepadLStickDown,  GLFW_GAMEPAD_AXIS_LEFT_Y,           1,      +0.25f,  +1.0f);
    MAP_ANALOG(ImGuiKey_GamepadRStickLeft,  GLFW_GAMEPAD_AXIS_RIGHT_X,          2,      -0.25f,  -1.0f);
    MAP_ANALOG(ImGuiKey_GamepadRStickRight, GLFW_GAMEPAD_AXIS_RIGHT_X,          2,      +0.25f,  +1.0f);
    MAP_ANALOG(ImGuiKey_GamepadRStickUp,    GLFW_GAMEPAD_AXIS_RIGHT_Y,          3,      -0.25f,  -1.0f);
    MAP_ANALOG(ImGuiKey_GamepadRStickDown,  GLFW_GAMEPAD_AXIS_RIGHT_Y,          3,      +0.25f,  +1.0f);
    #undef MAP_BUTTON
    #undef MAP_ANALOG
}